

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForAllHelp::CallForAllHelp(CallForAllHelp *this)

{
  ExitCodes in_stack_00000024;
  string *in_stack_00000028;
  CallForAllHelp *in_stack_00000030;
  allocator local_29;
  string local_28 [40];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,"This should be caught in your main function, see examples",&local_29);
  CallForAllHelp(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

CallForAllHelp()
        : CallForAllHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}